

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log.h
# Opt level: O0

void pbrt::
     LogFatal<char_const(&)[13],char_const(&)[11],char_const(&)[13],float&,char_const(&)[11],float&>
               (LogLevel level,char *file,int line,char *fmt,char (*args) [13],char (*args_1) [11],
               char (*args_2) [13],float *args_3,char (*args_4) [11],float *args_5)

{
  char (*in_RCX) [11];
  undefined4 in_EDX;
  char *in_stack_00000018;
  int in_stack_00000024;
  char *in_stack_00000028;
  LogLevel in_stack_00000034;
  string s;
  float *in_stack_ffffffffffffffa8;
  char (*in_stack_ffffffffffffffb0) [13];
  char (*in_stack_ffffffffffffffb8) [11];
  char (*in_stack_ffffffffffffffc0) [13];
  char *in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffe8;
  
  StringPrintf<char_const(&)[13],char_const(&)[11],char_const(&)[13],float&,char_const(&)[11],float&>
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
             in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_RCX,
             (float *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8));
  std::__cxx11::string::c_str();
  LogFatal(in_stack_00000034,in_stack_00000028,in_stack_00000024,in_stack_00000018);
}

Assistant:

inline void LogFatal(LogLevel level, const char *file, int line, const char *fmt,
                     Args &&... args) {
#ifdef PBRT_IS_GPU_CODE
    LogFatal(level, file, line, fmt);  // just the format string #yolo
#else
    std::string s = StringPrintf(fmt, std::forward<Args>(args)...);
    LogFatal(level, file, line, s.c_str());
#endif
}